

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExporterT.hh
# Opt level: O0

StatusInfo __thiscall
OpenMesh::IO::ExporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_>::status
          (ExporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_> *this,EdgeHandle _eh
          )

{
  bool bVar1;
  StatusInfo *pSVar2;
  undefined8 in_RDI;
  BaseHandle _eh_00;
  ArrayKernel *in_stack_ffffffffffffffd8;
  StatusInfo local_4;
  
  _eh_00.idx_ = (int)((ulong)in_RDI >> 0x20);
  bVar1 = ArrayKernel::has_edge_status((ArrayKernel *)0x1f4300);
  if (bVar1) {
    pSVar2 = ArrayKernel::status(in_stack_ffffffffffffffd8,(EdgeHandle)_eh_00.idx_);
    local_4.status_ = pSVar2->status_;
  }
  else {
    Attributes::StatusInfo::StatusInfo(&local_4);
  }
  return (StatusInfo)local_4.status_;
}

Assistant:

OpenMesh::Attributes::StatusInfo  status(EdgeHandle _eh) const override
  {
    if (mesh_.has_edge_status())
      return mesh_.status(_eh);
    return OpenMesh::Attributes::StatusInfo();
  }